

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

void __thiscall helics::apps::Clone::initialSetup(Clone *this)

{
  element_type *peVar1;
  
  if ((this->super_App).deactivated != false) {
    return;
  }
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ValueFederate)._vptr_ValueFederate[2])(peVar1,0,1);
  if ((this->super_App).outFileName._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->super_App).outFileName,0,0,"clone.json",10);
  }
  apps::App::loadInputFiles(&this->super_App);
  return;
}

Assistant:

void Clone::initialSetup()
{
    if (!deactivated) {
        fed->setFlagOption(HELICS_FLAG_OBSERVER);
        if (outFileName.empty()) {
            outFileName = "clone.json";
        }
        loadInputFiles();
    }
}